

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrs.cpp
# Opt level: O2

void __thiscall despot::FVRS::FVRS(FVRS *this,string *map)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)map);
  BaseRockSample::BaseRockSample(&this->super_BaseRockSample,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)&this->super_BaseRockSample = &PTR__BaseRockSample_0011da50;
  *(undefined ***)&(this->super_BaseRockSample).super_BeliefMDP = &PTR__FVRS_0011db68;
  *(undefined ***)&(this->super_BaseRockSample).super_StateIndexer = &PTR__FVRS_0011dc70;
  *(undefined ***)&(this->super_BaseRockSample).super_StatePolicy = &PTR__FVRS_0011dca8;
  (this->super_BaseRockSample).half_efficiency_distance_ =
       (double)((this->super_BaseRockSample).size_ + -1) * 1.4142135623730951 * 0.25 * 0.5;
  return;
}

Assistant:

FVRS::FVRS(string map) :
	BaseRockSample(map) {
	half_efficiency_distance_ = (size_ - 1) * sqrt(2) / 4 / 2;
}